

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

MaybeResult<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::block<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (MaybeResult<wasm::WATParser::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,
          bool folded)

{
  __index_type *__return_storage_ptr___00;
  uintptr_t uVar1;
  bool bVar2;
  __optional_ne_t<wasm::Name,_wasm::Name> _Var3;
  Index IVar4;
  HeapType *pHVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  Ok local_25a;
  allocator<char> local_259;
  string local_258;
  Err local_238;
  undefined1 local_218 [8];
  optional<wasm::Name> id;
  string local_1f8;
  Err local_1d8;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  allocator<char> local_1a1;
  string local_1a0;
  Err local_180;
  Err local_160;
  Err *local_140;
  Err *err_1;
  Result<wasm::WATParser::Ok> _val_1;
  Result<wasm::WATParser::Ok> insts;
  Err local_e0;
  Err *local_c0;
  Err *err;
  undefined1 local_a8 [8];
  Result<wasm::HeapType> _val;
  Result<wasm::HeapType> type;
  optional<wasm::Name> label;
  Index pos;
  bool folded_local;
  ParseModuleTypesCtx *ctx_local;
  
  IVar4 = ParseInput::getPos(&ctx->in);
  if (folded) {
    bVar6 = sv("block",5);
    bVar2 = ParseInput::takeSExprStart(&ctx->in,bVar6);
    if (!bVar2) {
      MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  else {
    bVar6 = sv("block",5);
    bVar2 = ParseInput::takeKeyword(&ctx->in,bVar6);
    if (!bVar2) {
      MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  ParseInput::takeID((optional<wasm::Name> *)
                     ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20),
                     &ctx->in);
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20);
  blocktype<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
            ((Result<wasm::HeapType> *)__return_storage_ptr___00,ctx);
  Result<wasm::HeapType>::Result
            ((Result<wasm::HeapType> *)local_a8,(Result<wasm::HeapType> *)__return_storage_ptr___00)
  ;
  local_c0 = Result<wasm::HeapType>::getErr((Result<wasm::HeapType> *)local_a8);
  bVar2 = local_c0 != (Err *)0x0;
  if (bVar2) {
    WATParser::Err::Err(&local_e0,local_c0);
    MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__,&local_e0);
    WATParser::Err::~Err(&local_e0);
  }
  Result<wasm::HeapType>::~Result((Result<wasm::HeapType> *)local_a8);
  if (bVar2) goto LAB_01de448c;
  instrs<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
            ((Result<wasm::WATParser::Ok> *)
             ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20),ctx);
  Result<wasm::WATParser::Ok>::Result
            ((Result<wasm::WATParser::Ok> *)&err_1,
             (Result<wasm::WATParser::Ok> *)
             ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
  local_140 = Result<wasm::WATParser::Ok>::getErr((Result<wasm::WATParser::Ok> *)&err_1);
  bVar2 = local_140 == (Err *)0x0;
  if (!bVar2) {
    WATParser::Err::Err(&local_160,local_140);
    MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__,&local_160);
    WATParser::Err::~Err(&local_160);
  }
  Result<wasm::WATParser::Ok>::~Result((Result<wasm::WATParser::Ok> *)&err_1);
  if (bVar2) {
    if (folded) {
      bVar2 = ParseInput::takeRParen(&ctx->in);
      if (bVar2) {
LAB_01de43d5:
        pHVar5 = Result<wasm::HeapType>::operator*
                           ((Result<wasm::HeapType> *)
                            ((long)&_val.val.
                                    super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                            0x20));
        uVar1 = pHVar5->id;
        Result<wasm::WATParser::Ok>::operator*
                  ((Result<wasm::WATParser::Ok> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                           .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                  );
        NullInstrParserCtx::makeBlock<wasm::HeapType>((NullInstrParserCtx *)ctx,IVar4,uVar1);
        MaybeResult<wasm::WATParser::Ok>::MaybeResult<wasm::WATParser::Ok>
                  (__return_storage_ptr__,&local_25a);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a0,"expected \')\' at end of block",&local_1a1);
        ParseInput::err(&local_180,&ctx->in,&local_1a0);
        MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__,&local_180);
        WATParser::Err::~Err(&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::allocator<char>::~allocator(&local_1a1);
      }
    }
    else {
      local_1b8 = sv("end",3);
      bVar2 = ParseInput::takeKeyword(&ctx->in,local_1b8);
      if (bVar2) {
        ParseInput::takeID((optional<wasm::Name> *)local_218,&ctx->in);
        bVar2 = std::optional::operator_cast_to_bool((optional *)local_218);
        if ((!bVar2) ||
           (_Var3 = std::operator!=((optional<wasm::Name> *)local_218,
                                    (optional<wasm::Name> *)
                                    ((long)&type.val.
                                            super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>
                                            .
                                            super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                            .
                                            super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                            .
                                            super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                            .
                                            super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                    + 0x20)), !_Var3)) goto LAB_01de43d5;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_258,"end label does not match block label",&local_259);
        ParseInput::err(&local_238,&ctx->in,&local_258);
        MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__,&local_238);
        WATParser::Err::~Err(&local_238);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator(&local_259);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,"expected \'end\' at end of block",
                   (allocator<char> *)
                   &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>.field_0x17);
        ParseInput::err(&local_1d8,&ctx->in,&local_1f8);
        MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__,&local_1d8);
        WATParser::Err::~Err(&local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>.field_0x17);
      }
    }
  }
  Result<wasm::WATParser::Ok>::~Result
            ((Result<wasm::WATParser::Ok> *)
             ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
LAB_01de448c:
  Result<wasm::HeapType>::~Result
            ((Result<wasm::HeapType> *)
             ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::InstrT> block(Ctx& ctx, bool folded) {
  auto pos = ctx.in.getPos();

  if (folded) {
    if (!ctx.in.takeSExprStart("block"sv)) {
      return {};
    }
  } else {
    if (!ctx.in.takeKeyword("block"sv)) {
      return {};
    }
  }

  auto label = ctx.in.takeID();

  auto type = blocktype(ctx);
  CHECK_ERR(type);

  auto insts = instrs(ctx);
  CHECK_ERR(insts);

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of block");
    }
  } else {
    if (!ctx.in.takeKeyword("end"sv)) {
      return ctx.in.err("expected 'end' at end of block");
    }
    auto id = ctx.in.takeID();
    if (id && id != label) {
      return ctx.in.err("end label does not match block label");
    }
  }

  return ctx.makeBlock(pos, label, *type, std::move(*insts));
}